

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::SPxWeightST<double>::generate(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  Array<double> *this_00;
  double *pdVar1;
  double dVar2;
  uint uVar3;
  SVSetBase<double> *pSVar4;
  int *piVar5;
  Array<double> *pAVar6;
  int iVar7;
  int iVar8;
  SVectorBase<double> *pSVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  Nonzero<double> *pNVar11;
  ulong uVar12;
  SPxWeightST<double> *this_01;
  int iVar13;
  int iVar14;
  Array<double> *pAVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  ulong uVar20;
  Array<double> *pAVar21;
  Real RVar22;
  DataArray<soplex::SPxId> pref;
  DataArray<int> row;
  DataArray<int> col;
  SPxId tmpId;
  Desc desc;
  ulong local_158;
  SPxId *local_140;
  undefined8 local_138;
  int local_12c;
  SVectorBase<double> *local_128;
  undefined8 uStack_120;
  DataKey local_110;
  DataKey local_108;
  DataKey local_100;
  int *local_f8;
  undefined8 local_f0;
  SPxWeightST<double> *local_e8;
  uint local_dc;
  Array<double> *local_d8;
  undefined8 uStack_d0;
  int local_c0;
  int local_bc;
  int *local_b8;
  undefined8 local_b0;
  DataArray<int> *local_a8;
  ulong local_a0;
  DataKey local_98;
  Compare<double> local_90;
  Array<double> *local_88;
  undefined8 uStack_80;
  Desc local_70;
  
  local_98.info = 0;
  local_98.idx = -1;
  local_a8 = &this->forbidden;
  DataArray<int>::reSize(local_a8,(base->thecovectors->set).thenum);
  pAVar21 = &this->rowWeight;
  std::vector<double,_std::allocator<double>_>::resize
            (&pAVar21->data,
             (long)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  this_00 = &this->colWeight;
  std::vector<double,_std::allocator<double>_>::resize
            (&this_00->data,
             (long)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  pAVar15 = this_00;
  pAVar6 = pAVar21;
  if (base->theRep == COLUMN) {
    pAVar15 = pAVar21;
    pAVar6 = this_00;
  }
  this->weight = pAVar6;
  this->coWeight = pAVar15;
  local_e8 = this;
  local_d8 = pAVar21;
  local_88 = this_00;
  (*(this->super_SPxStarter<double>)._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<double>::Desc::Desc(&local_70,base);
  iVar13 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
           thenum + (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
  local_140 = (SPxId *)0x0;
  local_138 = 0x3ff3333333333333;
  iVar14 = iVar13;
  if (iVar13 < 1) {
    iVar14 = 0;
    iVar13 = 1;
  }
  spx_alloc<soplex::SPxId*>(&local_140,iVar13);
  local_100.idx =
       (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.thenum
  ;
  local_f8 = (int *)0x0;
  local_f0 = 0x3ff3333333333333;
  local_100.info = local_100.idx;
  if (local_100.idx < 1) {
    local_100.idx = 1;
    local_100.info = 0;
  }
  spx_alloc<int*>(&local_f8,local_100.idx);
  iVar13 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
           thenum;
  local_b8 = (int *)0x0;
  local_b0 = 0x3ff3333333333333;
  local_c0 = 0;
  if (0 < iVar13) {
    local_c0 = iVar13;
  }
  local_bc = 1;
  if (0 < iVar13) {
    local_bc = local_c0;
  }
  spx_alloc<int*>(&local_b8,local_bc);
  if (0 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar10 = 0;
    do {
      local_f8[lVar10] = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  local_90.weight =
       (local_d8->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<double>>(local_f8,local_100.info,&local_90,0,true);
  if (0 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar10 = 0;
    do {
      local_b8[lVar10] = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum);
  }
  local_90.weight =
       (local_88->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<double>>(local_b8,local_c0,&local_90,0,true);
  if (0 < iVar14) {
    uVar20 = 0;
    local_128 = (SVectorBase<double> *)((ulong)local_128 & 0xffffffff00000000);
    iVar13 = 0;
    do {
      lVar10 = (long)iVar13;
      lVar16 = (long)(int)local_128;
      dVar2 = (local_88->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_b8[lVar16]];
      pdVar1 = (local_d8->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + local_f8[lVar10];
      iVar8 = (int)uVar20;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
        local_110 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thekey[local_b8[lVar16]];
        SPxColId::SPxColId((SPxColId *)&local_108,&local_110);
        iVar7 = (int)local_128 + 1;
        local_140[iVar8].super_DataKey = local_108;
        local_140[iVar8].super_DataKey.info = 1;
        uVar17 = iVar8 + 1;
        uVar20 = (ulong)uVar17;
        local_128 = (SVectorBase<double> *)CONCAT44(local_128._4_4_,iVar7);
        if (((base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum <= iVar7) && ((int)uVar17 < iVar14)) {
          uVar12 = (long)(int)uVar17;
          do {
            local_110 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set.thekey[local_f8[lVar10]];
            SPxRowId::SPxRowId((SPxRowId *)&local_108,&local_110);
            lVar10 = lVar10 + 1;
            uVar20 = uVar12 + 1;
            local_140[uVar12].super_DataKey = local_108;
            local_140[uVar12].super_DataKey.info = -1;
            uVar12 = uVar20;
          } while ((long)uVar20 < (long)iVar14);
          iVar13 = (int)lVar10;
        }
      }
      else {
        local_110 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thekey[local_f8[lVar10]];
        SPxRowId::SPxRowId((SPxRowId *)&local_108,&local_110);
        iVar13 = iVar13 + 1;
        local_140[iVar8].super_DataKey = local_108;
        local_140[iVar8].super_DataKey.info = -1;
        uVar17 = iVar8 + 1;
        uVar20 = (ulong)uVar17;
        if (((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum <= iVar13) && ((int)uVar17 < iVar14)) {
          uVar12 = (long)(int)uVar17;
          do {
            local_110 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set.thekey[local_b8[lVar16]];
            SPxColId::SPxColId((SPxColId *)&local_108,&local_110);
            lVar16 = lVar16 + 1;
            uVar20 = uVar12 + 1;
            local_140[uVar12].super_DataKey = local_108;
            local_140[uVar12].super_DataKey.info = 1;
            uVar12 = uVar20;
          } while ((long)uVar20 < (long)iVar14);
          local_128 = (SVectorBase<double> *)CONCAT44(local_128._4_4_,(int)lVar16);
        }
      }
    } while ((int)uVar20 < iVar14);
  }
  if (local_b8 != (int *)0x0) {
    free(local_b8);
    local_b8 = (int *)0x0;
  }
  this_01 = local_e8;
  if (local_f8 != (int *)0x0) {
    free(local_f8);
    local_f8 = (int *)0x0;
  }
  pSVar4 = base->thecovectors;
  uVar17 = (pSVar4->set).thenum;
  local_158 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    piVar5 = (this_01->forbidden).data;
    lVar10 = 0;
    do {
      piVar5[lVar10] = 0;
      lVar10 = lVar10 + 1;
      local_158 = (ulong)(pSVar4->set).thenum;
    } while (lVar10 < (long)local_158);
  }
  uVar20 = 0;
  bVar19 = base->theRep == COLUMN;
  if (!bVar19) {
    uVar20 = (ulong)(iVar14 - 1);
  }
  if (iVar14 <= (int)uVar20 || (int)uVar20 < 0) {
LAB_0020860b:
    (*(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(base,&local_70);
    if (local_140 != (SPxId *)0x0) {
      free(local_140);
      local_140 = (SPxId *)0x0;
    }
    if (local_70.colstat.data != (Status *)0x0) {
      free(local_70.colstat.data);
      local_70.colstat.data = (Status *)0x0;
    }
    if (local_70.rowstat.data != (Status *)0x0) {
      free(local_70.rowstat.data);
    }
    return;
  }
  iVar13 = (uint)bVar19 * 2 + -1;
  local_d8 = (Array<double> *)0x0;
  uStack_d0 = 0;
  local_12c = iVar13;
  do {
    uVar18 = (uint)uVar20;
    local_98 = local_140[uVar20].super_DataKey;
    local_a0 = uVar20;
    pSVar9 = SPxSolverBase<double>::vector(base,(SPxId *)&local_98);
    uVar17 = pSVar9->memused;
    uVar12 = (ulong)uVar17;
    if (uVar12 == 1) {
      uVar3 = pSVar9->m_elem->idx;
      iVar8 = (this_01->forbidden).data[(int)uVar3];
      uVar17 = 0xffffffff;
      if (iVar8 < 2) {
        local_158 = (ulong)((int)local_158 + (uint)(iVar8 == 1));
        uVar17 = uVar3;
      }
    }
    else {
      if ((int)uVar17 < 1) {
        local_d8 = (Array<double> *)0x0;
      }
      else {
        lVar10 = uVar12 + 1;
        pNVar11 = pSVar9->m_elem + uVar12;
        pAVar21 = (Array<double> *)0x0;
        do {
          pNVar11 = pNVar11 + -1;
          local_d8 = (Array<double> *)ABS(pNVar11->val);
          if (ABS(pNVar11->val) <= (double)pAVar21) {
            local_d8 = pAVar21;
          }
          lVar10 = lVar10 + -1;
          pAVar21 = local_d8;
        } while (1 < lVar10);
      }
      uStack_d0 = 0;
      if ((int)uVar17 < 1) {
        uVar17 = 0xffffffff;
      }
      else {
        iVar8 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thenum;
        lVar10 = uVar12 + 1;
        lVar16 = uVar12 * 0x10 + -8;
        uVar17 = 0xffffffff;
        local_128 = pSVar9;
        local_dc = uVar18;
        do {
          uVar18 = *(uint *)((long)&local_128->m_elem->val + lVar16);
          if ((local_e8->forbidden).data[(int)uVar18] == 0) {
            iVar13 = (base->thecovectors->set).theitem
                     [(base->thecovectors->set).thekey[(int)uVar18].idx].data.
                     super_SVectorBase<double>.memused;
            local_88 = *(Array<double> **)((long)local_128->m_elem + lVar16 + -8);
            uStack_80 = 0;
            iVar7 = (*(local_e8->super_SPxStarter<double>)._vptr_SPxStarter[6])();
            dVar2 = *(double *)(*(long *)CONCAT44(extraout_var,iVar7) + 0x40);
            uVar20 = -(ulong)(dVar2 == 1.0);
            if ((double)(~uVar20 & (ulong)(dVar2 * 0.001) | uVar20 & 0x3f50624dd2f1a9fc) *
                (double)local_d8 < ABS((double)local_88) && iVar13 < iVar8) {
              uVar17 = uVar18;
              iVar8 = iVar13;
            }
            uVar20 = (ulong)local_dc;
          }
          uVar18 = (uint)uVar20;
          lVar10 = lVar10 + -1;
          lVar16 = lVar16 + -0x10;
          pSVar9 = local_128;
          this_01 = local_e8;
          iVar13 = local_12c;
        } while (1 < lVar10);
      }
    }
    if ((int)uVar17 < 0) {
      if (base->theRep == COLUMN) {
        bVar19 = true;
        setPrimalStatus(this_01,&local_70,base,local_140 + local_a0);
      }
      else {
        bVar19 = true;
        setDualStatus<double>(&local_70,base,local_140 + local_a0);
      }
    }
    else {
      (this_01->forbidden).data[uVar17] = 2;
      if (base->theRep == COLUMN) {
        setDualStatus<double>(&local_70,base,local_140 + local_a0);
      }
      else {
        setPrimalStatus(this_01,&local_70,base,local_140 + local_a0);
      }
      lVar10 = (long)pSVar9->memused;
      if (0 < lVar10) {
        lVar16 = lVar10 + 1;
        lVar10 = lVar10 * 0x10 + -8;
        do {
          local_128 = *(SVectorBase<double> **)((long)pSVar9->m_elem + lVar10 + -8);
          uStack_120 = 0;
          iVar13 = *(int *)((long)&pSVar9->m_elem->val + lVar10);
          iVar8 = (*(this_01->super_SPxStarter<double>)._vptr_SPxStarter[6])(this_01);
          RVar22 = Tolerances::floatingPointFeastol(*(Tolerances **)CONCAT44(extraout_var_00,iVar8))
          ;
          piVar5 = (this_01->forbidden).data;
          if ((piVar5[iVar13] == 0) &&
             ((RVar22 * (double)local_d8 < (double)local_128 ||
              (RVar22 * (double)local_d8 < -(double)local_128)))) {
            piVar5[iVar13] = 1;
            local_158 = (ulong)((int)local_158 - 1);
          }
          lVar16 = lVar16 + -1;
          lVar10 = lVar10 + -0x10;
        } while (1 < lVar16);
      }
      iVar13 = local_12c;
      bVar19 = true;
      uVar17 = (int)local_158 - 1;
      local_158 = (ulong)uVar17;
      if (uVar17 == 0) {
        if (base->theRep == COLUMN) {
          while ((uVar18 = uVar18 + iVar13, -1 < (int)uVar18 && ((int)uVar18 < iVar14))) {
            setPrimalStatus(this_01,&local_70,base,local_140 + uVar18);
          }
          iVar8 = local_a8->thesize;
          if ((long)iVar8 < 1) {
LAB_002085e8:
            uVar18 = iVar8 - 1;
          }
          else {
            uVar18 = iVar8 - 1;
            lVar10 = (long)iVar8;
            do {
              if ((this_01->forbidden).data[lVar10 + -1] < 2) {
                local_100 = (DataKey)SPxSolverBase<double>::coId(base,uVar18);
                setDualStatus<double>(&local_70,base,(SPxId *)&local_100);
              }
              uVar18 = uVar18 - 1;
              lVar16 = lVar10 + -1;
              bVar19 = 0 < lVar10;
              lVar10 = lVar16;
            } while (lVar16 != 0 && bVar19);
          }
        }
        else {
          while ((uVar18 = uVar18 + iVar13, -1 < (int)uVar18 && ((int)uVar18 < iVar14))) {
            setDualStatus<double>(&local_70,base,local_140 + uVar18);
          }
          iVar8 = local_a8->thesize;
          if ((long)iVar8 < 1) goto LAB_002085e8;
          uVar18 = iVar8 - 1;
          lVar10 = (long)iVar8;
          do {
            if ((this_01->forbidden).data[lVar10 + -1] < 2) {
              local_100 = (DataKey)SPxSolverBase<double>::coId(base,uVar18);
              setPrimalStatus(this_01,&local_70,base,(SPxId *)&local_100);
            }
            uVar18 = uVar18 - 1;
            lVar16 = lVar10 + -1;
            bVar19 = 0 < lVar10;
            lVar10 = lVar16;
          } while (lVar16 != 0 && bVar19);
        }
        local_158 = 0;
        bVar19 = false;
      }
    }
    if (!bVar19) goto LAB_0020860b;
    uVar18 = uVar18 + iVar13;
    uVar20 = (ulong)uVar18;
    if (((int)uVar18 < 0) || (iVar14 <= (int)uVar18)) goto LAB_0020860b;
  } while( true );
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}